

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,char>,fmt::v7::formatter<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,char>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  long lVar4;
  iterator iVar5;
  undefined8 local_60;
  formatter<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>,_char,_void>
  f;
  
  local_60 = 0xffffffff00000000;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>.width._0_2_ = 0;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>.precision._2_1_ = 1;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>._2_4_ = 0x20;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>.type = '\0';
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>._9_1_ = 0;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>.fill.data_[0] = '\0';
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.
  super_basic_format_specs<char>.fill.data_[1] = '\0';
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.width_ref.kind = none;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.width_ref.val.name.size_.
  _0_4_ = 0;
  f.
  super_formatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_void>
  .super_formatter<fmt::v7::basic_string_view<char>,_char,_void>.specs_.precision_ref.kind = none;
  pcVar3 = formatter<fmt::v7::basic_string_view<char>,char,void>::
           parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                     ((formatter<fmt::v7::basic_string_view<char>,char,void> *)&local_60,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  lVar4 = (long)pcVar3 - (long)pcVar2;
  if (-1 < lVar4) {
    (parse_ctx->format_str_).data_ = pcVar2 + lVar4;
    psVar1 = &(parse_ctx->format_str_).size_;
    *psVar1 = *psVar1 - lVar4;
    iVar5 = formatter<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,char>,char,void>
            ::format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                      ((formatter<fmt::v7::arg_join<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,char>,char,void>
                        *)&local_60,
                       (arg_join<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                        *)arg,ctx);
    (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)iVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/core.h"
              ,0x13c,"negative value");
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }